

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_file(coda_cdf_product *product_file)

{
  int iVar1;
  bool local_35;
  uint local_30;
  uint local_2c;
  int32_t flags;
  int32_t encoding;
  int64_t gdr_offset;
  coda_cdf_product *pcStack_18;
  int32_t record_type;
  coda_cdf_product *product_file_local;
  
  pcStack_18 = product_file;
  iVar1 = read_bytes(product_file->raw_product,0x10,4,(void *)((long)&gdr_offset + 4));
  if (iVar1 < 0) {
    return -1;
  }
  swap4((void *)((long)&gdr_offset + 4));
  if (gdr_offset._4_4_ != 1) {
    coda_set_error(-300,"CDF file has invalid record type (%d) for CDR record",
                   (ulong)gdr_offset._4_4_);
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x14,8,&flags);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x1c,4,&pcStack_18->cdf_version);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x20,4,&pcStack_18->cdf_release);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x24,4,&local_2c);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x28,4,&local_30);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x34,4,&pcStack_18->cdf_increment);
  if (iVar1 < 0) {
    return -1;
  }
  swap8(&flags);
  swap4(&pcStack_18->cdf_version);
  swap4(&pcStack_18->cdf_release);
  swap4(&local_2c);
  swap4(&local_30);
  swap4(&pcStack_18->cdf_increment);
  if ((_flags < 0) || (pcStack_18->file_size <= _flags)) {
    coda_set_error(-300,"CDF file has invalid offset for GDR record");
    return -1;
  }
  if (local_2c - 1 < 2) goto LAB_0018dd1c;
  if (local_2c == 3) {
LAB_0018dd36:
    coda_set_error(-200,
                   "CDF file contains unsupported floating point format (only IEEE 754 floating point format is supported)"
                  );
    return -1;
  }
  if (local_2c != 4) {
    if (local_2c == 5) {
LAB_0018dd1c:
      pcStack_18->endianness = coda_big_endian;
      goto LAB_0018dd77;
    }
    if (local_2c != 6) {
      if (((local_2c == 7) || (local_2c == 9)) || (local_2c - 0xb < 2)) goto LAB_0018dd1c;
      if (local_2c != 0xd) {
        if (local_2c - 0xe < 2) goto LAB_0018dd36;
        if (local_2c != 0x10) {
          coda_set_error(-200,"CDF file has unsupported encoding %d",(ulong)local_2c);
          return -1;
        }
      }
    }
  }
  pcStack_18->endianness = coda_little_endian;
LAB_0018dd77:
  if ((local_30 & 1) == 0) {
    pcStack_18->array_ordering = coda_array_ordering_fortran;
  }
  else {
    pcStack_18->array_ordering = coda_array_ordering_c;
  }
  if ((local_30 & 2) == 0) {
    coda_set_error(-200,"multi-file CDF is not supported");
    product_file_local._4_4_ = -1;
  }
  else {
    local_35 = (local_30 & 4) != 0 && (local_30 & 8) != 0;
    pcStack_18->has_md5_chksum = (uint)local_35;
    iVar1 = read_GDR(pcStack_18,_flags);
    if (iVar1 == 0) {
      product_file_local._4_4_ = 0;
    }
    else {
      product_file_local._4_4_ = -1;
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_file(coda_cdf_product *product_file)
{
    int32_t record_type;
    int64_t gdr_offset;
    int32_t encoding;
    int32_t flags;

    /* CDF Descriptor Record */
    if (read_bytes(product_file->raw_product, 16, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 1)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for CDR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, 20, 8, &gdr_offset) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 28, 4, &product_file->cdf_version) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 32, 4, &product_file->cdf_release) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 36, 4, &encoding) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 40, 4, &flags) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 52, 4, &product_file->cdf_increment) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&gdr_offset);
    swap_int32(&product_file->cdf_version);
    swap_int32(&product_file->cdf_release);
    swap_int32(&encoding);
    swap_int32(&flags);
    swap_int32(&product_file->cdf_increment);
#endif
    if (gdr_offset < 0 || gdr_offset >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for GDR record");
        return -1;
    }

    switch (encoding)
    {
        case 1:        /* NETWORK */
        case 2:        /* SUN */
        case 5:        /* SGi */
        case 7:        /* IBMRS */
        case 9:        /* MAC */
        case 11:       /* HP */
        case 12:       /* NeXT */
            product_file->endianness = coda_big_endian;
            break;
        case 4:        /* DECSTATION */
        case 6:        /* IBMPC */
        case 13:       /* ALPHAOSF1 */
        case 16:       /* ALPHAVMSi */
            product_file->endianness = coda_little_endian;
            break;
        case 3:        /* VAX */
        case 14:       /* ALPHAVMSd */
        case 15:       /* ALPHAVMSg */
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF file contains unsupported floating point format "
                           "(only IEEE 754 floating point format is supported)");
            return -1;
        default:
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF file has unsupported encoding %d", encoding);
            return -1;
    }
    if (flags & 1)
    {
        /* row-major ordering */
        product_file->array_ordering = coda_array_ordering_c;
    }
    else
    {
        /* column-major ordering */
        product_file->array_ordering = coda_array_ordering_fortran;
    }
    if (!(flags & 2))
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "multi-file CDF is not supported");
        return -1;
    }
    product_file->has_md5_chksum = ((flags & 4) && (flags & 8));

    /* Global Descriptor Record */
    if (read_GDR(product_file, gdr_offset) != 0)
    {
        return -1;
    }

    return 0;
}